

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::ruby::GenerateBinaryDescriptor
          (ruby *this,FileDescriptor *file,Printer *printer,string *error)

{
  FileDescriptor *file_00;
  string_view s;
  string local_b0;
  string local_80;
  undefined1 local_60 [16];
  string local_50;
  string_view local_30;
  Printer *local_20;
  string *error_local;
  Printer *printer_local;
  FileDescriptor *file_local;
  FileDescriptor *file_01;
  
  local_20 = printer;
  error_local = (string *)file;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\ndescriptor_data = \"$descriptor_data$\"\n\npool = ::Google::Protobuf::DescriptorPool.generated_pool\npool.add_serialized_file(descriptor_data)\n\n"
            );
  SerializedDescriptor_abi_cxx11_(&local_80,(ruby *)printer_local,file_00);
  local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_80);
  s._M_len = local_60._8_8_;
  s._M_str = (char *)error;
  (anonymous_namespace)::RubyEscape_abi_cxx11_(&local_50,local_60._0_8_,s);
  DumpImportList_abi_cxx11_(&local_b0,(ruby *)printer_local,file_01);
  io::Printer::Print<char[16],std::__cxx11::string,char[8],std::__cxx11::string>
            ((Printer *)file,local_30,(char (*) [16])"descriptor_data",&local_50,
             (char (*) [8])0x99500f,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void GenerateBinaryDescriptor(const FileDescriptor* file, io::Printer* printer,
                              std::string* error) {
  printer->Print(R"(
descriptor_data = "$descriptor_data$"

pool = ::Google::Protobuf::DescriptorPool.generated_pool
pool.add_serialized_file(descriptor_data)

)",
                 "descriptor_data", RubyEscape(SerializedDescriptor(file)),
                 "imports", DumpImportList(file));
}